

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O2

void deqp::gles2::Functional::logComment(TestContext *testCtx,char *comment)

{
  ostringstream *this;
  undefined1 local_190 [384];
  
  local_190._0_8_ = testCtx->m_log;
  this = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"// ");
  std::operator<<((ostream *)this,comment);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  return;
}

Assistant:

static void logComment (tcu::TestContext& testCtx, const char* comment)
{
	testCtx.getLog() << TestLog::Message << "// " << comment << TestLog::EndMessage;
}